

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_degree_with2(REF_CELL ref_cell,REF_INT node0,REF_INT node1,REF_INT *degree)

{
  REF_INT local_38;
  REF_INT local_34;
  int local_30;
  REF_INT local_2c;
  int local_28;
  REF_INT cell;
  REF_INT cell_node;
  REF_INT item;
  REF_INT *degree_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_CELL ref_cell_local;
  
  *degree = 0;
  if ((node0 < 0) || (ref_cell->ref_adj->nnode <= node0)) {
    local_30 = -1;
  }
  else {
    local_30 = ref_cell->ref_adj->first[node0];
  }
  cell = local_30;
  if (local_30 == -1) {
    local_34 = -1;
  }
  else {
    local_34 = ref_cell->ref_adj->item[local_30].ref;
  }
  local_2c = local_34;
  while (cell != -1) {
    for (local_28 = 0; local_28 < ref_cell->node_per; local_28 = local_28 + 1) {
      if (node1 == ref_cell->c2n[local_28 + ref_cell->size_per * local_2c]) {
        *degree = *degree + 1;
      }
    }
    cell = ref_cell->ref_adj->item[cell].next;
    if (cell == -1) {
      local_38 = -1;
    }
    else {
      local_38 = ref_cell->ref_adj->item[cell].ref;
    }
    local_2c = local_38;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_degree_with2(REF_CELL ref_cell, REF_INT node0,
                                         REF_INT node1, REF_INT *degree) {
  REF_INT item, cell_node, cell;

  *degree = 0;
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    (*degree)++;
  }

  return REF_SUCCESS;
}